

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

SolverOption * __thiscall
mp::SolverOptionManager::FindOption(SolverOptionManager *this,char *name,bool wildcardvalues)

{
  SolverOption *pSVar1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  pointer pbVar7;
  pointer pbVar8;
  SolverOption *pSVar9;
  pointer pbVar10;
  long lVar11;
  string name_str;
  DummyOption option;
  allocator<char> local_161;
  pointer local_160;
  char *local_158;
  SolverOption *local_150;
  SolverOption *local_148 [2];
  undefined1 local_138 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  pointer local_110 [2];
  SolverOption local_100;
  
  local_158 = name;
  SolverOption::SolverOption(&local_100,name,"",(ValueArrayRef)ZEXT816(0),false);
  local_100._vptr_SolverOption = (_func_int **)&PTR__SolverOption_005d3768;
  local_148[0] = &local_100;
  cVar5 = std::
          _Rb_tree<mp::SolverOption_*,_mp::SolverOption_*,_std::_Identity<mp::SolverOption_*>,_mp::SolverOptionManager::OptionNameLess,_std::allocator<mp::SolverOption_*>_>
          ::find(&(this->options_)._M_t,local_148);
  p_Var2 = &(this->options_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar5._M_node == p_Var2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_148,local_158,(allocator<char> *)(local_138 + 0x18));
    p_Var6 = (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var6 != p_Var2) {
      do {
        local_138._16_8_ = p_Var2;
        pSVar9 = local_148[0];
        local_150 = *(SolverOption **)(p_Var6 + 1);
        pbVar10 = (local_150->inline_synonyms_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar7 = (local_150->inline_synonyms_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar11 = (long)pbVar7 - (long)pbVar10 >> 7;
        pbVar8 = pbVar10;
        if (0 < lVar11) {
          pbVar8 = (pointer)((long)&(pbVar10->_M_dataplus)._M_p +
                            ((long)pbVar7 - (long)pbVar10 & 0xffffffffffffff80U));
          lVar11 = lVar11 + 1;
          pbVar10 = pbVar10 + 2;
          local_160 = pbVar7;
          do {
            iVar4 = strcasecmp((char *)pSVar9,pbVar10[-2]._M_dataplus._M_p);
            if (iVar4 == 0) {
              pbVar7 = local_160;
              pbVar10 = pbVar10 + -2;
              goto LAB_0046439f;
            }
            iVar4 = strcasecmp((char *)pSVar9,pbVar10[-1]._M_dataplus._M_p);
            if (iVar4 == 0) {
              pbVar7 = local_160;
              pbVar10 = pbVar10 + -1;
              goto LAB_0046439f;
            }
            iVar4 = strcasecmp((char *)pSVar9,(pbVar10->_M_dataplus)._M_p);
            pbVar7 = local_160;
            if (iVar4 == 0) goto LAB_0046439f;
            iVar4 = strcasecmp((char *)pSVar9,pbVar10[1]._M_dataplus._M_p);
            pbVar7 = local_160;
            if (iVar4 == 0) {
              pbVar10 = pbVar10 + 1;
              goto LAB_0046439f;
            }
            lVar11 = lVar11 + -1;
            pbVar10 = pbVar10 + 4;
          } while (1 < lVar11);
        }
        lVar11 = (long)pbVar7 - (long)pbVar8 >> 5;
        if (lVar11 == 1) {
LAB_0046436f:
          iVar4 = strcasecmp((char *)local_148[0],(pbVar8->_M_dataplus)._M_p);
          pbVar10 = pbVar8;
          if (iVar4 != 0) {
            pbVar10 = pbVar7;
          }
        }
        else if (lVar11 == 2) {
LAB_00464355:
          iVar4 = strcasecmp((char *)local_148[0],(pbVar8->_M_dataplus)._M_p);
          pbVar10 = pbVar8;
          if (iVar4 != 0) {
            pbVar8 = pbVar8 + 1;
            goto LAB_0046436f;
          }
        }
        else {
          pbVar10 = pbVar7;
          if ((lVar11 == 3) &&
             (iVar4 = strcasecmp((char *)local_148[0],(pbVar8->_M_dataplus)._M_p), pbVar10 = pbVar8,
             iVar4 != 0)) {
            pbVar8 = pbVar8 + 1;
            goto LAB_00464355;
          }
        }
LAB_0046439f:
        pSVar9 = local_150;
        if (pbVar10 != pbVar7) goto LAB_00464421;
        if (wildcardvalues) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_138 + 0x18),local_158,&local_161);
          bVar3 = SolverOption::wc_match(local_150,(string *)(local_138 + 0x18));
          if ((undefined1 *)local_120._M_allocated_capacity != local_138 + 0x28) {
            operator_delete((void *)local_120._M_allocated_capacity,
                            (ulong)((long)&(local_110[0]->_M_dataplus)._M_p + 1));
          }
        }
        else {
          bVar3 = false;
        }
        if (bVar3 != false) {
          pSVar9 = *(SolverOption **)(p_Var6 + 1);
          goto LAB_00464421;
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        p_Var2 = (_Rb_tree_header *)local_138._16_8_;
      } while (p_Var6 != (_Base_ptr)local_138._16_8_);
    }
    pSVar9 = (SolverOption *)0x0;
LAB_00464421:
    if (local_148[0] != (SolverOption *)local_138) {
      operator_delete(local_148[0],local_138._0_8_ + 1);
    }
  }
  else {
    pSVar1 = *(SolverOption **)(cVar5._M_node + 1);
    pSVar9 = (SolverOption *)0x0;
    if (!wildcardvalues) {
      pSVar9 = pSVar1;
    }
    if ((pSVar1->wc_headtails_).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (pSVar1->wc_headtails_).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pSVar9 = pSVar1;
    }
  }
  SolverOption::~SolverOption(&local_100);
  return pSVar9;
}

Assistant:

SolverOption *SolverOptionManager::FindOption(
    const char *name, bool wildcardvalues) const {
  struct DummyOption : SolverOption {
    DummyOption(const char *name) : SolverOption(name, "") {}
    void Write(fmt::Writer &) {}
    void Parse(const char *&, bool) {}
    Option_Type type() {
      return Option_Type::BOOL;
    }
  };
  DummyOption option(name);
  // find by name
  OptionSet::const_iterator i = options_.find(&option);
  if (i != options_.end()) {
    if ((*i)->is_wildcard() && wildcardvalues)
      return 0;
    return *i;
  }

  // find by inline synonyms and wildcards. Case-insensitive
  std::string name_str {name};
  for (OptionSet::const_iterator i = options_.begin();
    i != options_.end(); ++i)
  {
    if (std::find_if((*i)->inline_synonyms().begin(),
                    (*i)->inline_synonyms().end(),
                    [&name_str](const std::string& syn) {
                     return 0==strcasecmp(name_str.c_str(), syn.c_str()); } ) !=
        (*i)->inline_synonyms().end()) {
      return *i;
    }
    /// Wildcards
    if (wildcardvalues && (*i)->wc_match(name))
      return *i;
  }
  return 0;
}